

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

SampledSpectrum
pbrt::
SampleT_maj<pbrt::NanoVDBMedium,pbrt::Integrator::Tr(pbrt::Interaction_const&,pbrt::Interaction_const&,pbrt::SampledWavelengths_const&)const::__0>
          (Ray *ray,Float tMax,Float u,RNG *rng,SampledWavelengths *lambda,
          anon_class_16_2_09643cd6 callback)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Point3f p;
  array<float,_4> aVar4;
  bool bVar5;
  enable_if_t<std::is_floating_point_v<float>,_bool> eVar6;
  Float *pFVar7;
  RayMajorantSegment *pRVar8;
  long in_RDI;
  float in_XMM0_Da;
  type tVar9;
  Float FVar10;
  float fVar11;
  float fVar12;
  SampledSpectrum T_maj_00;
  undefined1 auVar21 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined8 uVar20;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  float in_XMM1_Da;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar31 [56];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  Vector3<float> VVar32;
  Point3f PVar33;
  SampledSpectrum SVar34;
  Float dt_1;
  MediumProperties mp;
  Float t;
  Float tMin;
  Float dt;
  optional<pbrt::RayMajorantSegment> seg;
  bool done;
  SampledSpectrum T_maj;
  MajorantIterator iter;
  NanoVDBMedium *medium;
  undefined4 in_stack_fffffffffffffbb8;
  Float in_stack_fffffffffffffbbc;
  undefined4 in_stack_fffffffffffffbc0;
  Float in_stack_fffffffffffffbc4;
  undefined1 in_stack_fffffffffffffbc8 [16];
  Vector3<float> in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffc08;
  Float in_stack_fffffffffffffc0c;
  float in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  DDAMajorantIterator *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc78;
  float fVar35;
  undefined1 in_stack_fffffffffffffcb8 [16];
  undefined1 in_stack_fffffffffffffcc8 [16];
  undefined4 in_stack_fffffffffffffce0;
  float in_stack_fffffffffffffce4;
  float in_stack_fffffffffffffce8;
  undefined8 local_2b8;
  undefined8 local_2b0;
  float local_194;
  float local_170;
  Float local_15c;
  optional local_158 [31];
  byte local_139;
  undefined8 local_138;
  undefined8 uStack_130;
  NanoVDBMedium *local_a0;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_6c;
  float local_64;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  undefined4 local_48;
  float local_30;
  float local_2c;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar25 [64];
  
  local_58 = *(undefined4 *)(in_RDI + 0x14);
  local_60 = *(undefined8 *)(in_RDI + 0xc);
  local_50 = local_60;
  local_48 = local_58;
  local_30 = in_XMM1_Da;
  local_2c = in_XMM0_Da;
  tVar9 = Length<float>(in_stack_fffffffffffffbe8);
  local_2c = local_2c * tVar9;
  local_80 = *(undefined4 *)(in_RDI + 0x14);
  local_88 = *(undefined8 *)(in_RDI + 0xc);
  auVar21 = ZEXT856(0);
  VVar32.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffc0c;
  VVar32.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffc08;
  VVar32.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc10;
  local_78 = local_88;
  local_70 = local_80;
  VVar32 = Normalize<float>(VVar32);
  local_90 = VVar32.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._0_8_ = VVar32.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13._8_56_ = auVar21;
  local_98 = vmovlpd_avx(auVar13._0_16_);
  *(undefined8 *)(in_RDI + 0xc) = local_98;
  *(float *)(in_RDI + 0x14) = local_90;
  local_6c = local_98;
  local_64 = local_90;
  local_a0 = TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GridMedium,_pbrt::RGBGridMedium,_pbrt::CloudMedium,_pbrt::NanoVDBMedium>
             ::Cast<pbrt::NanoVDBMedium>
                       ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GridMedium,_pbrt::RGBGridMedium,_pbrt::CloudMedium,_pbrt::NanoVDBMedium>
                         *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  Ray::Ray((Ray *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
           (Ray *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  NanoVDBMedium::SampleRay
            (in_stack_fffffffffffffcc8._8_8_,in_stack_fffffffffffffcc8._0_8_,
             in_stack_fffffffffffffcb8._12_4_,in_stack_fffffffffffffcb8._0_8_);
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbbc);
  local_139 = 0;
  do {
    if (((local_139 ^ 0xff) & 1) == 0) {
      SampledSpectrum::SampledSpectrum
                ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 in_stack_fffffffffffffbbc);
      break;
    }
    DDAMajorantIterator::Next(in_stack_fffffffffffffc28);
    bVar5 = pstd::optional::operator_cast_to_bool(local_158);
    if (bVar5) {
      pstd::optional<pbrt::RayMajorantSegment>::operator->
                ((optional<pbrt::RayMajorantSegment> *)0x93b855);
      pFVar7 = SampledSpectrum::operator[]
                         ((SampledSpectrum *)
                          CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                          (int)in_stack_fffffffffffffbbc);
      if ((*pFVar7 != 0.0) || (NAN(*pFVar7))) {
        pRVar8 = pstd::optional<pbrt::RayMajorantSegment>::operator->
                           ((optional<pbrt::RayMajorantSegment> *)0x93ba23);
        local_194 = pRVar8->tMin;
        while( true ) {
          fVar35 = local_194;
          pstd::optional<pbrt::RayMajorantSegment>::operator->
                    ((optional<pbrt::RayMajorantSegment> *)0x93ba75);
          SampledSpectrum::operator[]
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                     (int)in_stack_fffffffffffffbbc);
          FVar10 = SampleExponential(0.0,1.3566772e-38);
          fVar1 = fVar35 + FVar10;
          fVar11 = RNG::Uniform<float>((RNG *)CONCAT44(in_stack_fffffffffffffbc4,
                                                       in_stack_fffffffffffffbc0));
          local_30 = fVar11;
          pRVar8 = pstd::optional<pbrt::RayMajorantSegment>::operator->
                             ((optional<pbrt::RayMajorantSegment> *)0x93bb17);
          if (pRVar8->tMax <= fVar1) break;
          auVar23._8_4_ = 0x80000000;
          auVar23._0_8_ = &DAT_8000000080000000;
          auVar23._12_4_ = 0x80000000;
          auVar31 = ZEXT856(auVar23._8_8_);
          fVar12 = -(fVar1 - local_194);
          pRVar8 = pstd::optional<pbrt::RayMajorantSegment>::operator->
                             ((optional<pbrt::RayMajorantSegment> *)0x93bb7a);
          auVar21 = (undefined1  [56])0x0;
          SVar34 = operator*(in_stack_fffffffffffffbc4,
                             (SampledSpectrum *)
                             CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
          auVar27._0_8_ = SVar34.values.values._8_8_;
          auVar27._8_56_ = auVar31;
          auVar16._0_8_ = SVar34.values.values._0_8_;
          auVar16._8_56_ = auVar21;
          vmovlpd_avx(auVar16._0_16_);
          vmovlpd_avx(auVar27._0_16_);
          SVar34 = FastExp((SampledSpectrum *)
                           CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
          auVar28._0_8_ = SVar34.values.values._8_8_;
          auVar28._8_56_ = auVar31;
          auVar17._0_8_ = SVar34.values.values._0_8_;
          auVar17._8_56_ = auVar21;
          auVar24 = auVar28._0_16_;
          T_maj_00.values.values = auVar17._0_16_;
          vmovlpd_avx((undefined1  [16])T_maj_00.values.values);
          vmovlpd_avx(auVar24);
          SampledSpectrum::operator*=
                    (in_stack_fffffffffffffbc8._8_8_,in_stack_fffffffffffffbc8._0_8_);
          uVar20 = 0;
          PVar33 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffc14,
                                                   in_stack_fffffffffffffc10),
                                   in_stack_fffffffffffffc0c);
          auVar3._8_8_ = uVar20;
          auVar3._0_8_ = PVar33.super_Tuple3<pbrt::Point3,_float>._0_8_;
          vmovlpd_avx(auVar3);
          p.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffffce4;
          p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffce0;
          p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffce8;
          NanoVDBMedium::SamplePoint
                    (in_stack_fffffffffffffcc8._0_8_,p,in_stack_fffffffffffffcb8._8_8_);
          uVar20 = 0;
          PVar33 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffc14,
                                                   in_stack_fffffffffffffc10),
                                   in_stack_fffffffffffffc0c);
          in_stack_fffffffffffffc28 = PVar33.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar2._8_8_ = uVar20;
          auVar2._0_8_ = in_stack_fffffffffffffc28;
          vmovlpd_avx(auVar2);
          MediumProperties::MediumProperties
                    ((MediumProperties *)
                     CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                     (MediumProperties *)
                     CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
          pstd::optional<pbrt::RayMajorantSegment>::operator->
                    ((optional<pbrt::RayMajorantSegment> *)0x93bd59);
          PVar33.super_Tuple3<pbrt::Point3,_float>.y = FVar10;
          PVar33.super_Tuple3<pbrt::Point3,_float>.x = fVar11;
          PVar33.super_Tuple3<pbrt::Point3,_float>.z = fVar35;
          SVar34.values.values[1] = fVar12;
          SVar34.values.values[0] = (float)in_stack_fffffffffffffc78;
          SVar34.values.values._8_8_ = pRVar8;
          bVar5 = Integrator::Tr::anon_class_16_2_09643cd6::operator()
                            (auVar24._8_8_,PVar33,auVar24._0_8_,SVar34,T_maj_00);
          in_stack_fffffffffffffc14 = CONCAT13(bVar5,(int3)in_stack_fffffffffffffc14);
          if (!bVar5) {
            local_139 = 1;
            goto LAB_0093bf64;
          }
          SampledSpectrum::SampledSpectrum
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                     in_stack_fffffffffffffbbc);
          local_138 = local_2b8;
          uStack_130 = local_2b0;
          local_194 = fVar1;
        }
        pRVar8 = pstd::optional<pbrt::RayMajorantSegment>::operator->
                           ((optional<pbrt::RayMajorantSegment> *)0x93be66);
        in_stack_fffffffffffffc0c = (Float)((ulong)pRVar8 >> 0x20);
        eVar6 = IsInf<float>(0.0);
        if (eVar6) {
          std::numeric_limits<float>::max();
        }
        auVar24._8_4_ = 0x80000000;
        auVar24._0_8_ = &DAT_8000000080000000;
        auVar24._12_4_ = 0x80000000;
        auVar31 = ZEXT856(auVar24._8_8_);
        pstd::optional<pbrt::RayMajorantSegment>::operator->
                  ((optional<pbrt::RayMajorantSegment> *)0x93bee2);
        auVar21 = (undefined1  [56])0x0;
        SVar34 = operator*(in_stack_fffffffffffffbc4,
                           (SampledSpectrum *)
                           CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        auVar29._0_8_ = SVar34.values.values._8_8_;
        auVar29._8_56_ = auVar31;
        auVar18._0_8_ = SVar34.values.values._0_8_;
        auVar18._8_56_ = auVar21;
        vmovlpd_avx(auVar18._0_16_);
        vmovlpd_avx(auVar29._0_16_);
        SVar34 = FastExp((SampledSpectrum *)
                         CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
        auVar30._0_8_ = SVar34.values.values._8_8_;
        auVar30._8_56_ = auVar31;
        auVar19._0_8_ = SVar34.values.values._0_8_;
        auVar19._8_56_ = auVar21;
        in_stack_fffffffffffffbc8 = auVar30._0_16_;
        vmovlpd_avx(auVar19._0_16_);
        vmovlpd_avx(in_stack_fffffffffffffbc8);
        SampledSpectrum::operator*=(auVar31._0_8_,auVar30._0_8_);
LAB_0093bf64:
        local_15c = 0.0;
      }
      else {
        pRVar8 = pstd::optional<pbrt::RayMajorantSegment>::operator->
                           ((optional<pbrt::RayMajorantSegment> *)0x93b897);
        local_170 = pRVar8->tMax;
        pRVar8 = pstd::optional<pbrt::RayMajorantSegment>::operator->
                           ((optional<pbrt::RayMajorantSegment> *)0x93b8c4);
        local_170 = local_170 - pRVar8->tMin;
        eVar6 = IsInf<float>(0.0);
        if (eVar6) {
          local_170 = std::numeric_limits<float>::max();
        }
        auVar22._8_4_ = 0x80000000;
        auVar22._0_8_ = &DAT_8000000080000000;
        auVar22._12_4_ = 0x80000000;
        auVar31 = ZEXT856(auVar22._8_8_);
        in_stack_fffffffffffffce4 = -local_170;
        pRVar8 = pstd::optional<pbrt::RayMajorantSegment>::operator->
                           ((optional<pbrt::RayMajorantSegment> *)0x93b976);
        in_stack_fffffffffffffce8 = SUB84(pRVar8,0);
        auVar21 = (undefined1  [56])0x0;
        SVar34 = operator*(in_stack_fffffffffffffbc4,
                           (SampledSpectrum *)
                           CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        auVar25._0_8_ = SVar34.values.values._8_8_;
        auVar25._8_56_ = auVar31;
        auVar14._0_8_ = SVar34.values.values._0_8_;
        auVar14._8_56_ = auVar21;
        vmovlpd_avx(auVar14._0_16_);
        vmovlpd_avx(auVar25._0_16_);
        SVar34 = FastExp((SampledSpectrum *)
                         CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
        auVar26._0_8_ = SVar34.values.values._8_8_;
        auVar26._8_56_ = auVar31;
        auVar15._0_8_ = SVar34.values.values._0_8_;
        auVar15._8_56_ = auVar21;
        in_stack_fffffffffffffcb8 = auVar26._0_16_;
        in_stack_fffffffffffffcc8 = auVar15._0_16_;
        vmovlpd_avx(in_stack_fffffffffffffcc8);
        vmovlpd_avx(in_stack_fffffffffffffcb8);
        SampledSpectrum::operator*=(in_stack_fffffffffffffbc8._8_8_,in_stack_fffffffffffffbc8._0_8_)
        ;
        local_15c = 2.8026e-45;
      }
    }
    else {
      local_10 = local_138;
      local_8 = uStack_130;
      local_15c = 1.4013e-45;
    }
    pstd::optional<pbrt::RayMajorantSegment>::~optional
              ((optional<pbrt::RayMajorantSegment> *)0x93bf7c);
    in_stack_fffffffffffffbc4 = local_15c;
  } while ((local_15c == 0.0) || (local_15c != 1.4013e-45));
  aVar4.values[2] = (float)(undefined4)local_8;
  aVar4.values[3] = (float)local_8._4_4_;
  aVar4.values[0] = (float)(undefined4)local_10;
  aVar4.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar4.values;
}

Assistant:

PBRT_CPU_GPU SampledSpectrum SampleT_maj(Ray ray, Float tMax, Float u, RNG &rng,
                                         const SampledWavelengths &lambda, F callback) {
    // Normalize ray direction and update _tMax_ accordingly
    tMax *= Length(ray.d);
    ray.d = Normalize(ray.d);

    // Initialize _MajorantIterator_ for ray majorant sampling
    ConcreteMedium *medium = ray.medium.Cast<ConcreteMedium>();
    typename ConcreteMedium::MajorantIterator iter = medium->SampleRay(ray, tMax, lambda);

    // Generate ray majorant samples until termination
    SampledSpectrum T_maj(1.f);
    bool done = false;
    while (!done) {
        // Get next majorant segment from iterator and sample it
        pstd::optional<RayMajorantSegment> seg = iter.Next();
        if (!seg)
            return T_maj;
        // Handle zero-valued majorant for current segment
        if (seg->sigma_maj[0] == 0) {
            Float dt = seg->tMax - seg->tMin;
            // Handle infinite _dt_ for ray majorant segment
            if (IsInf(dt))
                dt = std::numeric_limits<Float>::max();

            T_maj *= FastExp(-dt * seg->sigma_maj);
            continue;
        }

        // Generate samples along current majorant segment
        Float tMin = seg->tMin;
        while (true) {
            // Try to generate sample along current majorant segment
            Float t = tMin + SampleExponential(u, seg->sigma_maj[0]);
            PBRT_DBG("Sampled t = %f from tMin %f u %f sigma_maj[0] %f\n", t, tMin, u,
                     seg->sigma_maj[0]);
            u = rng.Uniform<Float>();
            if (t < seg->tMax) {
                // Call callback function for sample within segment
                PBRT_DBG("t < seg->tMax\n");
                T_maj *= FastExp(-(t - tMin) * seg->sigma_maj);
                MediumProperties mp = medium->SamplePoint(ray(t), lambda);
                if (!callback(ray(t), mp, seg->sigma_maj, T_maj)) {
                    // Returning out of doubly-nested while loop is not as good perf. wise
                    // on the GPU vs using "done" here.
                    done = true;
                    break;
                }
                T_maj = SampledSpectrum(1.f);
                tMin = t;

            } else {
                // Handle sample past end of majorant segment
                Float dt = seg->tMax - tMin;
                // Handle infinite _dt_ for ray majorant segment
                if (IsInf(dt))
                    dt = std::numeric_limits<Float>::max();

                T_maj *= FastExp(-dt * seg->sigma_maj);
                PBRT_DBG("Past end, added dt %f * maj[0] %f\n", dt, seg->sigma_maj[0]);
                break;
            }
        }
    }
    return SampledSpectrum(1.f);
}